

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search(ON_RTree *this,ON_RTreeSphere *a_sphere,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  undefined1 local_40 [8];
  ON_RTreeSearchResultCallback result;
  void *a_context_local;
  _func_bool_void_ptr_ON__INT_PTR *a_resultCallback_local;
  ON_RTreeSphere *a_sphere_local;
  ON_RTree *this_local;
  
  if ((this->m_root == (ON_RTreeNode *)0x0) || (a_sphere == (ON_RTreeSphere *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    local_40 = (undefined1  [8])a_context;
    result.m_context = a_resultCallback;
    result.m_resultCallback = (ON_RTreeSearchCallback)a_context;
    this_local._7_1_ = SearchHelper(this->m_root,a_sphere,(ON_RTreeSearchResultCallback *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search( 
  struct ON_RTreeSphere* a_sphere,
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_id),
  void* a_context
  ) const
{
  if ( 0 == m_root || 0 == a_sphere )
    return false;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;

  return SearchHelper(m_root, a_sphere, result);
}